

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O3

void __thiscall BronKerbosch::printReads(BronKerbosch *this,ostream *os,alignment_set_t *set)

{
  size_type sVar1;
  string local_50;
  
  sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                    (set,0);
  AlignmentRecord::getName_abi_cxx11_
            (&local_50,
             (this->alignments_).
             super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
             super__Vector_impl_data._M_start[sVar1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(set,sVar1)
  ;
  if (sVar1 != 0xffffffffffffffff) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      AlignmentRecord::getName_abi_cxx11_
                (&local_50,
                 (this->alignments_).
                 super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                        (set,sVar1);
    } while (sVar1 != 0xffffffffffffffff);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

void BronKerbosch::printReads(std::ostream& os, alignment_set_t set) {
    auto j = set.find_first();
    os << alignments_[j]->getName();

    for (j = set.find_next(j); j != alignment_set_t::npos; j = set.find_next(j)) {
        os << "," << alignments_[j]->getName();
    }
    os << endl;
}